

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall V2Transport::ProcessReceivedPacketBytes(V2Transport *this)

{
  byte *pbVar1;
  pointer puVar2;
  byte *pbVar3;
  pointer puVar4;
  Span<std::byte> contents;
  bool bVar5;
  bool bVar6;
  RecvState RVar7;
  uint32_t uVar8;
  ulong uVar9;
  Logger *pLVar10;
  long in_FS_OFFSET;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Span<const_std::byte> aad;
  bool ignore;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(this->m_recv_buffer).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar9 == 3) {
    input.m_size = 3;
    input.m_data = pbVar1;
    uVar8 = BIP324Cipher::DecryptLength(&this->m_cipher,input);
    this->m_recv_len = uVar8;
    bVar5 = true;
    if (uVar8 < 0x3d090e) goto LAB_001a10c5;
    pLVar10 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
    if (bVar5) {
      logging_function._M_str = "ProcessReceivedPacketBytes";
      logging_function._M_len = 0x1a;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<unsigned_int,long>
                (logging_function,source_file,0x4a9,NET,Debug,(ConstevalFormatString<2U>)0x7d1d9b,
                 &this->m_recv_len,&this->m_nodeid);
    }
  }
  else {
    bVar5 = true;
    if ((uVar9 < 4) || (uVar9 != this->m_recv_len + 0x14)) goto LAB_001a10c5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_recv_decode_buffer,(ulong)this->m_recv_len);
    ignore = false;
    puVar2 = (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    input_00.m_data = puVar2 + 3;
    input_00.m_size =
         (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + (-3 - (long)puVar2);
    pbVar1 = (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    aad.m_size = (long)(this->m_recv_aad).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pbVar1;
    pbVar3 = (this->m_recv_decode_buffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    contents.m_size =
         (long)(this->m_recv_decode_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar3;
    contents.m_data = pbVar3;
    aad.m_data = pbVar1;
    bVar6 = BIP324Cipher::Decrypt(&this->m_cipher,input_00,aad,&ignore,contents);
    if (bVar6) {
      puVar2 = (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_recv_aad).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)puVar4 - (long)puVar2);
      }
      RandAddEvent(*(uint32_t *)
                    ((this->m_recv_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + -4));
      if (ignore == false) {
        if (this->m_recv_state == VERSION) {
          RVar7 = APP;
        }
        else {
          if (this->m_recv_state != APP) goto LAB_001a1068;
          RVar7 = APP_READY;
        }
        this->m_recv_state = RVar7;
      }
LAB_001a1068:
      puVar2 = (this->m_recv_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->m_recv_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_recv_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)puVar4 - (long)puVar2);
      }
      if (this->m_recv_state != APP_READY) {
        puVar2 = (this->m_recv_decode_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = (this->m_recv_decode_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (this->m_recv_decode_buffer).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this->m_recv_decode_buffer).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this->m_recv_decode_buffer).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2,(long)puVar4 - (long)puVar2);
        }
      }
      goto LAB_001a10c5;
    }
    pLVar10 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
    if (bVar5) {
      logging_function_00._M_str = "ProcessReceivedPacketBytes";
      logging_function_00._M_len = 0x1a;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file_00._M_len = 0x57;
      LogPrintFormatInternal<unsigned_int,long>
                (logging_function_00,source_file_00,0x4b8,NET,Debug,
                 (ConstevalFormatString<2U>)0x7d1dd5,&this->m_recv_len,&this->m_nodeid);
    }
  }
  bVar5 = false;
LAB_001a10c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ProcessReceivedPacketBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    Assume(m_recv_state == RecvState::VERSION || m_recv_state == RecvState::APP);

    // The maximum permitted contents length for a packet, consisting of:
    // - 0x00 byte: indicating long message type encoding
    // - 12 bytes of message type
    // - payload
    static constexpr size_t MAX_CONTENTS_LEN =
        1 + CMessageHeader::COMMAND_SIZE +
        std::min<size_t>(MAX_SIZE, MAX_PROTOCOL_MESSAGE_LENGTH);

    if (m_recv_buffer.size() == BIP324Cipher::LENGTH_LEN) {
        // Length descriptor received.
        m_recv_len = m_cipher.DecryptLength(MakeByteSpan(m_recv_buffer));
        if (m_recv_len > MAX_CONTENTS_LEN) {
            LogDebug(BCLog::NET, "V2 transport error: packet too large (%u bytes), peer=%d\n", m_recv_len, m_nodeid);
            return false;
        }
    } else if (m_recv_buffer.size() > BIP324Cipher::LENGTH_LEN && m_recv_buffer.size() == m_recv_len + BIP324Cipher::EXPANSION) {
        // Ciphertext received, decrypt it into m_recv_decode_buffer.
        // Note that it is impossible to reach this branch without hitting the branch above first,
        // as GetMaxBytesToProcess only allows up to LENGTH_LEN into the buffer before that point.
        m_recv_decode_buffer.resize(m_recv_len);
        bool ignore{false};
        bool ret = m_cipher.Decrypt(
            /*input=*/MakeByteSpan(m_recv_buffer).subspan(BIP324Cipher::LENGTH_LEN),
            /*aad=*/MakeByteSpan(m_recv_aad),
            /*ignore=*/ignore,
            /*contents=*/MakeWritableByteSpan(m_recv_decode_buffer));
        if (!ret) {
            LogDebug(BCLog::NET, "V2 transport error: packet decryption failure (%u bytes), peer=%d\n", m_recv_len, m_nodeid);
            return false;
        }
        // We have decrypted a valid packet with the AAD we expected, so clear the expected AAD.
        ClearShrink(m_recv_aad);
        // Feed the last 4 bytes of the Poly1305 authentication tag (and its timing) into our RNG.
        RandAddEvent(ReadLE32(m_recv_buffer.data() + m_recv_buffer.size() - 4));

        // At this point we have a valid packet decrypted into m_recv_decode_buffer. If it's not a
        // decoy, which we simply ignore, use the current state to decide what to do with it.
        if (!ignore) {
            switch (m_recv_state) {
            case RecvState::VERSION:
                // Version message received; transition to application phase. The contents is
                // ignored, but can be used for future extensions.
                SetReceiveState(RecvState::APP);
                break;
            case RecvState::APP:
                // Application message decrypted correctly. It can be extracted using GetMessage().
                SetReceiveState(RecvState::APP_READY);
                break;
            default:
                // Any other state is invalid (this function should not have been called).
                Assume(false);
            }
        }
        // Wipe the receive buffer where the next packet will be received into.
        ClearShrink(m_recv_buffer);
        // In all but APP_READY state, we can wipe the decoded contents.
        if (m_recv_state != RecvState::APP_READY) ClearShrink(m_recv_decode_buffer);
    } else {
        // We either have less than 3 bytes, so we don't know the packet's length yet, or more
        // than 3 bytes but less than the packet's full ciphertext. Wait until those arrive.
    }
    return true;
}